

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O1

entry * __thiscall
libtorrent::create_torrent::generate(entry *__return_storage_ptr__,create_torrent *this)

{
  vector<aux::vector<sha256_hash,_piece_index_t::diff_type>,_file_index_t> *file_piece_hash;
  file_flags_t fVar1;
  uint uVar2;
  pointer pcVar3;
  pointer ppVar4;
  size_type sVar5;
  long lVar6;
  pointer pbVar7;
  pointer pcVar8;
  libtorrent *this_00;
  pointer pdVar9;
  pointer pdVar10;
  integer_type iVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  data_type dVar15;
  entry *peVar16;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar17;
  reference value;
  ulong uVar18;
  NodePtr commit_data;
  compact_rbtree_node<void_*> *pcVar19;
  entry *this_01;
  list_type *plVar20;
  entry *peVar21;
  pointer pcVar22;
  dictionary_type *pdVar23;
  node_ptr pcVar24;
  string_type *psVar25;
  char *pcVar26;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *url;
  pointer ppVar27;
  digest32<256L> *p;
  pointer pdVar28;
  int iVar29;
  sha256_hash *in_R8;
  ulong uVar30;
  int iVar31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *url_1;
  node_ptr *ppcVar32;
  pointer pbVar33;
  pointer pdVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  string_view key_11;
  string_view key_12;
  string_view key_13;
  string_view key_14;
  string_view key_15;
  string_view key_16;
  string_view key_17;
  string_view key_18;
  span<const_char> str;
  string_view key_19;
  string_view key_20;
  string_view key_21;
  span<const_char> str_00;
  string_view key_22;
  string_view key_23;
  string_view key_24;
  string_view key_25;
  span<const_char> str_01;
  string_view key_26;
  string_view key_27;
  string_view key_28;
  string_view key_29;
  pair<boost::intrusive::compact_rbtree_node<void_*>_*,_bool> pVar37;
  span<const_libtorrent::digest32<256L>_> leaves;
  string_view p_00;
  string_view p_01;
  string_view p_02;
  string_view p_03;
  string_view p_04;
  string_view p_05;
  entry *dict;
  list_type node;
  list_type tier;
  insert_commit_data data;
  vector<sha256_hash,_file_index_t> fileroots;
  ulong local_280;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [32];
  entry *local_218;
  key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>_>_>
  local_210;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_208;
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [16];
  pointer local_1b8;
  string local_1b0;
  string local_190;
  ulong local_170;
  key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>_>_>
  local_168;
  string local_160;
  string_type local_140;
  string_type local_120;
  string_type local_100;
  string_type local_e0;
  string_type local_c0;
  string_type local_a0;
  string_type local_80;
  list_type local_60;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> local_48;
  
  if (((this->m_files).
       super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
       super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->m_files).
       super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
       super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
       ._M_impl.super__Vector_impl_data._M_finish) || (this->m_total_size == 0)) {
    local_268._0_4_ = 0xd3;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)local_268);
  }
  file_piece_hash = &this->m_file_piece_hash;
  bVar14 = anon_unknown_40::validate_v2_hashes(&this->m_files,file_piece_hash,this->m_piece_length);
  local_238[0x18] = bVar14;
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::vector
            (&local_48,
             &(this->m_piece_hash).
              super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            );
  bVar14 = anon_unknown_40::validate_v1_hashes
                     ((vector<sha1_hash,_piece_index_t> *)&local_48,this->m_total_size,
                      this->m_piece_length);
  if (local_48.
      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_238[0x18] == '\0' && !bVar14) {
    local_268._0_4_ = 0xaf;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)local_268);
  }
  entry::entry(__return_storage_ptr__);
  ppVar27 = (this->m_urls).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar27 !=
      (this->m_urls).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar3 = (ppVar27->first)._M_dataplus._M_p;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar3,pcVar3 + (ppVar27->first)._M_string_length);
    key._M_str = "announce";
    key._M_len = 8;
    peVar16 = entry::operator[](__return_storage_ptr__,key);
    entry::operator=(peVar16,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_nodes).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_nodes).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_00._M_str = "nodes";
    key_00._M_len = 5;
    peVar16 = entry::operator[](__return_storage_ptr__,key_00);
    pvVar17 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar16);
    ppVar27 = (this->m_nodes).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (this->m_nodes).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar27 != ppVar4) {
      do {
        ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::vector
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_268,2,
                   (allocator_type *)local_248);
        pcVar3 = (ppVar27->first)._M_dataplus._M_p;
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar3,pcVar3 + (ppVar27->first)._M_string_length);
        entry::operator=((entry *)local_268._0_8_,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        entry::operator=((entry *)(local_268._0_8_ + 0x28),(long)ppVar27->second);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                  (pvVar17,(vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                           local_268);
        ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_268);
        ppVar27 = ppVar27 + 1;
      } while (ppVar27 != ppVar4);
    }
  }
  ppVar27 = (this->m_urls).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (this->m_urls).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)ppVar4 - (long)ppVar27 >> 3) * -0x3333333333333333)) {
    local_268 = (undefined1  [16])0x0;
    local_258._0_8_ = 0;
    local_238._0_8_ = 0;
    local_248._0_8_ = 0;
    local_248._8_8_ = (char *)0x0;
    if (ppVar27 != ppVar4) {
      iVar31 = ppVar27->second;
      do {
        iVar29 = ppVar27->second;
        if (iVar29 != iVar31) {
          ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
          emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                    ((vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)local_268,
                     (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_248);
          uVar12 = local_248._0_8_;
          uVar13 = local_248._8_8_;
          peVar16 = (entry *)local_248._0_8_;
          iVar31 = iVar29;
          if (local_248._8_8_ != local_248._0_8_) {
            do {
              entry::~entry(peVar16);
              peVar16 = peVar16 + 1;
            } while (peVar16 != (entry *)uVar13);
            local_248._8_8_ = uVar12;
          }
        }
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)local_248,
                   &ppVar27->first);
        ppVar27 = ppVar27 + 1;
      } while (ppVar27 != ppVar4);
    }
    ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
    emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
              ((vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)local_268,
               (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_248);
    local_60.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_268._0_8_;
    local_60.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_268._8_8_;
    local_60.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_258._0_8_;
    local_268 = (undefined1  [16])0x0;
    local_258._0_8_ = 0;
    key_01._M_str = "announce-list";
    key_01._M_len = 0xd;
    peVar16 = entry::operator[](__return_storage_ptr__,key_01);
    entry::operator=(peVar16,&local_60);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector(&local_60);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_248);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_268);
  }
  sVar5 = (this->m_comment)._M_string_length;
  if (sVar5 != 0) {
    pcVar3 = (this->m_comment)._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_c0,pcVar3,pcVar3 + sVar5);
    key_02._M_str = "comment";
    key_02._M_len = 7;
    peVar16 = entry::operator[](__return_storage_ptr__,key_02);
    entry::operator=(peVar16,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  lVar6 = this->m_creation_date;
  if (lVar6 != 0) {
    key_03._M_str = "creation date";
    key_03._M_len = 0xd;
    peVar16 = entry::operator[](__return_storage_ptr__,key_03);
    entry::operator=(peVar16,lVar6);
  }
  sVar5 = (this->m_created_by)._M_string_length;
  if (sVar5 != 0) {
    pcVar3 = (this->m_created_by)._M_dataplus._M_p;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_e0,pcVar3,pcVar3 + sVar5);
    key_04._M_str = "created by";
    key_04._M_len = 10;
    peVar16 = entry::operator[](__return_storage_ptr__,key_04);
    entry::operator=(peVar16,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar33 = (this->m_url_seeds).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (this->m_url_seeds).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar33 != pbVar7) {
    if ((long)pbVar7 - (long)pbVar33 == 0x20) {
      pcVar3 = (pbVar33->_M_dataplus)._M_p;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,pcVar3,pcVar3 + pbVar33->_M_string_length);
      key_05._M_str = "url-list";
      key_05._M_len = 8;
      peVar16 = entry::operator[](__return_storage_ptr__,key_05);
      entry::operator=(peVar16,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      key_08._M_str = "url-list";
      key_08._M_len = 8;
      peVar16 = entry::operator[](__return_storage_ptr__,key_08);
      pbVar7 = (this->m_url_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar33 = (this->m_url_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar33 != pbVar7;
          pbVar33 = pbVar33 + 1) {
        pvVar17 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                  entry::list(peVar16);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string_const&>(pvVar17,pbVar33);
      }
    }
  }
  local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (pointer)0x0;
  if (local_238[0x18] != '\0') {
    ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::resize
              ((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> *)
               local_1c8,
               ((long)(this->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3);
    iVar31 = this->m_piece_length;
    iVar29 = iVar31 + 0x3fff;
    if (-1 < iVar31) {
      iVar29 = iVar31;
    }
    merkle_pad((sha256_hash *)local_268,iVar29 >> 0xe,1);
    key_06._M_str = "piece layers";
    key_06._M_len = 0xc;
    peVar16 = entry::operator[](__return_storage_ptr__,key_06);
    value = (reference)entry::dict_abi_cxx11_(peVar16);
    uVar18 = ((long)(this->m_files).
                    super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    .
                    super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_files).
                    super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    .
                    super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    if ((int)uVar18 != 0) {
      ppcVar32 = &(value->super_type).super_type.super_compact_rbtree_node<void_*>.left_;
      uVar30 = 0;
      do {
        pcVar22 = (this->m_files).
                  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                  .
                  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((((file_flags_t *)((long)(pcVar22 + uVar30) + 0x28))->m_val & 1) == 0) &&
           (*(int64_t *)((long)(pcVar22 + uVar30) + 0x20) != 0)) {
          pcVar8 = (file_piece_hash->
                   super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                   ).
                   super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          this_00 = *(libtorrent **)
                     &pcVar8[uVar30].
                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      .
                      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ;
          leaves.m_ptr = (digest32<256L> *)
                         ((long)*(pointer *)
                                 ((long)&pcVar8[uVar30].
                                         super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                         .
                                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                 + 8) - (long)this_00 >> 5);
          leaves.m_len = (difference_type)local_268;
          merkle_root((sha256_hash *)local_248,this_00,leaves,in_R8);
          *(undefined8 *)((((pointer)(local_1c8._0_8_ + uVar30 * 0x20))->m_number)._M_elems + 4) =
               local_238._0_8_;
          *(undefined8 *)((((pointer)(local_1c8._0_8_ + uVar30 * 0x20))->m_number)._M_elems + 6) =
               local_238._8_8_;
          *(undefined8 *)(((pointer)(local_1c8._0_8_ + uVar30 * 0x20))->m_number)._M_elems =
               local_248._0_8_;
          *(undefined8 *)((((pointer)(local_1c8._0_8_ + uVar30 * 0x20))->m_number)._M_elems + 2) =
               local_248._8_8_;
          pcVar8 = (file_piece_hash->
                   super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                   ).
                   super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (0x20 < (ulong)((long)*(pointer *)
                                    ((long)&pcVar8[uVar30].
                                            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                            .
                                            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                    + 8) -
                            *(long *)&pcVar8[uVar30].
                                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                      .
                                      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                            )) {
            local_248._0_8_ = local_238;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_248,(pointer)(local_1c8._0_8_ + uVar30 * 0x20),
                       (pointer)(local_1c8._0_8_ + uVar30 * 0x20) + 1);
            local_208.first._M_len = local_208.first._M_len & 0xffffffffffffff00;
            local_208.first._M_str = (char *)0x0;
            in_R8 = (sha256_hash *)0x0;
            local_210.traits_ =
                 (bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>
                  *)ppcVar32;
            local_1e8._0_8_ = ppcVar32;
            pVar37 = boost::intrusive::
                     bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,true>>::
                     insert_unique_check<std::__cxx11::string,boost::intrusive::detail::key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>>,boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>>>>
                               ((const_node_ptr *)local_1e8,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_248,&local_210,(insert_commit_data *)&local_208,(size_t *)0x0
                               );
            pcVar19 = pVar37.first;
            if (((undefined1  [16])pVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              commit_data = boost::container::dtl::
                            node_alloc_holder<boost::container::new_allocator<std::pair<std::__cxx11::string_const,libtorrent::entry>>,boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::tree_value_compare<std::pair<std::__cxx11::string_const,libtorrent::entry>*,libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>,bool,false>,bool>,unsigned_long,true,void>>
                            ::create_node<boost::container::try_emplace_t,std::__cxx11::string>
                                      ((node_alloc_holder<boost::container::new_allocator<std::pair<std::__cxx11::string_const,libtorrent::entry>>,boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::tree_value_compare<std::pair<std::__cxx11::string_const,libtorrent::entry>*,libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>,bool,false>,bool>,unsigned_long,true,void>>
                                        *)value,(try_emplace_t *)&local_210,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_248);
              boost::intrusive::
              bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
              ::insert_unique_commit
                        ((bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                          *)local_1e8,value,(insert_commit_data *)commit_data);
              pcVar19 = (compact_rbtree_node<void_*> *)local_1e8._0_8_;
            }
            if (pcVar19 == (compact_rbtree_node<void_*> *)0x0) {
              __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                            "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const std::basic_string<char>, libtorrent::entry>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const std::basic_string<char>, libtorrent::entry>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
                           );
            }
            psVar25 = entry::string_abi_cxx11_((entry *)&pcVar19[2].left_);
            if ((pointer)local_248._0_8_ != (pointer)local_238) {
              operator_delete((void *)local_248._0_8_,(ulong)(local_238._0_8_ + 1));
            }
            psVar25->_M_string_length = 0;
            *(psVar25->_M_dataplus)._M_p = '\0';
            ::std::__cxx11::string::reserve((ulong)psVar25);
            pcVar8 = (file_piece_hash->
                     super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                     ).
                     super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar9 = *(pointer *)
                      ((long)&pcVar8[uVar30].
                              super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                              .
                              super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      + 8);
            for (pdVar28 = *(pointer *)
                            &pcVar8[uVar30].
                             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                             .
                             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                ; pdVar28 != pdVar9; pdVar28 = pdVar28 + 1) {
              ::std::__cxx11::string::append((char *)psVar25,(ulong)pdVar28);
            }
          }
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 != (uVar18 & 0xffffffff));
    }
  }
  key_07._M_str = "info";
  key_07._M_len = 4;
  this_01 = entry::operator[](__return_storage_ptr__,key_07);
  peVar16 = &this->m_info_dict;
  dVar15 = entry::type(peVar16);
  if ((dVar15 == dictionary_t) || (dVar15 = entry::type(peVar16), dVar15 == preformatted_t)) {
    entry::operator=(this_01,peVar16);
  }
  else {
    if ((this->m_collections).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->m_collections).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      key_09._M_str = "collections";
      key_09._M_len = 0xb;
      peVar16 = entry::operator[](this_01,key_09);
      pbVar7 = (this->m_collections).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar33 = (this->m_collections).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar33 != pbVar7;
          pbVar33 = pbVar33 + 1) {
        pvVar17 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                  entry::list(peVar16);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string_const&>(pvVar17,pbVar33);
      }
    }
    if ((this->m_similar).
        super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->m_similar).
        super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      key_10._M_str = "similar";
      key_10._M_len = 7;
      peVar16 = entry::operator[](this_01,key_10);
      pdVar10 = (this->m_similar).
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pdVar34 = (this->m_similar).
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pdVar34 != pdVar10;
          pdVar34 = pdVar34 + 1) {
        pvVar17 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                  entry::list(peVar16);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<libtorrent::digest32<160l>const&>(pvVar17,pdVar34);
      }
    }
    pcVar3 = (this->m_name)._M_dataplus._M_p;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar3,pcVar3 + (this->m_name)._M_string_length);
    key_11._M_str = "name";
    key_11._M_len = 4;
    peVar16 = entry::operator[](this_01,key_11);
    entry::operator=(peVar16,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    sVar5 = (this->m_root_cert)._M_string_length;
    if (sVar5 != 0) {
      pcVar3 = (this->m_root_cert)._M_dataplus._M_p;
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_140,pcVar3,pcVar3 + sVar5);
      key_12._M_str = "ssl-cert";
      key_12._M_len = 8;
      peVar16 = entry::operator[](this_01,key_12);
      entry::operator=(peVar16,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->field_0x258 & 2) != 0) {
      key_13._M_str = "private";
      key_13._M_len = 7;
      peVar16 = entry::operator[](this_01,key_13);
      entry::operator=(peVar16,1);
    }
    if (bVar14) {
      if ((this->field_0x258 & 1) == 0) {
        pcVar22 = (this->m_files).
                  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                  .
                  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((this->field_0x258 & 4) != 0) && (lVar6 = pcVar22->mtime, lVar6 != 0)) {
          key_19._M_str = "mtime";
          key_19._M_len = 5;
          peVar16 = entry::operator[](this_01,key_19);
          entry::operator=(peVar16,lVar6);
        }
        iVar11 = pcVar22->size;
        key_20._M_str = "length";
        key_20._M_len = 6;
        peVar16 = entry::operator[](this_01,key_20);
        entry::operator=(peVar16,iVar11);
        fVar1.m_val = (pcVar22->flags).m_val;
        anon_unknown_40::add_file_attrs(this_01,fVar1,(bool)((this->field_0x258 & 8) >> 3));
        if ((fVar1.m_val & this->field_0x258 & 8) == 8) {
          lVar6 = *(long *)&(pcVar22->symlink)._M_dataplus;
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,lVar6,*(size_type *)((long)&pcVar22->symlink + 8) + lVar6)
          ;
          anon_unknown_40::add_symlink_path(this_01,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
        }
        pdVar34 = (this->m_filehashes).
                  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                  .
                  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pdVar34 !=
            (this->m_filehashes).
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          key_21._M_str = "sha1";
          key_21._M_len = 4;
          peVar16 = entry::operator[](this_01,key_21);
          str_00.m_len = 0x14;
          str_00.m_ptr = (char *)pdVar34;
          entry::operator=(peVar16,str_00);
        }
      }
      else {
        key_14._M_str = "files";
        key_14._M_len = 5;
        local_218 = entry::operator[](this_01,key_14);
        uVar18 = ((long)(this->m_files).
                        super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        .
                        super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_files).
                        super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        .
                        super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
        if ((int)uVar18 != 0) {
          local_170 = uVar18 & 0xffffffff;
          local_280 = 0;
          do {
            plVar20 = entry::list(local_218);
            ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::emplace_back<>
                      (plVar20);
            plVar20 = entry::list(local_218);
            peVar16 = (plVar20->
                      super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>).
                      _M_impl.super__Vector_impl_data._M_finish + -1;
            if (((this->field_0x258 & 4) != 0) &&
               (lVar6 = *(time_t *)
                         ((long)((this->m_files).
                                 super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                 .
                                 super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_280) + 0x30),
               lVar6 != 0)) {
              key_15._M_str = "mtime";
              key_15._M_len = 5;
              peVar21 = entry::operator[](peVar16,key_15);
              entry::operator=(peVar21,lVar6);
            }
            iVar11 = *(int64_t *)
                      ((long)((this->m_files).
                              super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                              .
                              super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_280) + 0x20);
            key_16._M_str = "length";
            key_16._M_len = 6;
            peVar21 = entry::operator[](peVar16,key_16);
            entry::operator=(peVar21,iVar11);
            key_17._M_str = "path";
            key_17._M_len = 4;
            peVar21 = entry::operator[](peVar16,key_17);
            pcVar22 = (this->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar26 = local_258;
            local_268._0_8_ = pcVar26;
            lVar6 = *(long *)&pcVar22[local_280].filename;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_268,lVar6,
                       *(size_type *)((long)(pcVar22 + local_280) + 8) + lVar6);
            p_00._M_str = pcVar26;
            p_00._M_len = local_268._0_8_;
            lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         *)local_248,(libtorrent *)local_268._8_8_,p_00);
            p_01._M_str = pcVar26;
            p_01._M_len = local_238._8_8_;
            lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         *)local_248,(libtorrent *)local_238._0_8_,p_01);
            while ((pointer)local_248._0_8_ != (pointer)0x0) {
              pvVar17 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                        entry::list(peVar21);
              ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                        (pvVar17,(basic_string_view<char,_std::char_traits<char>_> *)local_248);
              p_02._M_str = pcVar26;
              p_02._M_len = local_238._8_8_;
              lsplit_path(&local_208,(libtorrent *)local_238._0_8_,p_02);
              local_248._8_8_ = local_208.first._M_str;
              local_248._0_8_ = local_208.first._M_len;
              local_238._0_8_ = local_208.second._M_len;
              local_238._8_8_ = local_208.second._M_str;
            }
            if ((pointer)local_268._0_8_ != (pointer)local_258) {
              operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
            }
            fVar1.m_val = ((file_flags_t *)
                          ((long)((this->m_files).
                                  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                  .
                                  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_280) + 0x28))->
                          m_val;
            anon_unknown_40::add_file_attrs(peVar16,fVar1,(bool)((this->field_0x258 & 8) >> 3));
            if (((this->field_0x258 & 8) != 0) && ((fVar1.m_val & 8) != 0)) {
              pcVar22 = (this->m_files).
                        super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        .
                        super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
              lVar6 = *(long *)((long)(pcVar22 + local_280) + 0x38);
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_190,lVar6,
                         *(size_type *)((long)(pcVar22 + local_280) + 0x40) + lVar6);
              anon_unknown_40::add_symlink_path(peVar16,&local_190);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p,
                                local_190.field_2._M_allocated_capacity + 1);
              }
            }
            pdVar34 = (this->m_filehashes).
                      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      .
                      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pdVar34 !=
                (this->m_filehashes).
                super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                .
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_268 = (undefined1  [16])0x0;
              local_258._0_8_ = local_258._0_8_ & 0xffffffff00000000;
              pdVar10 = pdVar34 + local_280;
              uVar2 = pdVar34[local_280].m_number._M_elems[4];
              auVar36[0] = -((char)uVar2 == '\0');
              auVar36[1] = -((char)(uVar2 >> 8) == '\0');
              auVar36[2] = -((char)(uVar2 >> 0x10) == '\0');
              auVar36[3] = -((char)(uVar2 >> 0x18) == '\0');
              auVar36[4] = 0xff;
              auVar36[5] = 0xff;
              auVar36[6] = 0xff;
              auVar36[7] = 0xff;
              auVar36[8] = 0xff;
              auVar36[9] = 0xff;
              auVar36[10] = 0xff;
              auVar36[0xb] = 0xff;
              auVar36[0xc] = 0xff;
              auVar36[0xd] = 0xff;
              auVar36[0xe] = 0xff;
              auVar36[0xf] = 0xff;
              auVar35[0] = -((char)(pdVar10->m_number)._M_elems[0] == '\0');
              auVar35[1] = -(*(char *)((long)(pdVar10->m_number)._M_elems + 1) == '\0');
              auVar35[2] = -(*(char *)((long)(pdVar10->m_number)._M_elems + 2) == '\0');
              auVar35[3] = -(*(char *)((long)(pdVar10->m_number)._M_elems + 3) == '\0');
              auVar35[4] = -((char)(pdVar10->m_number)._M_elems[1] == '\0');
              auVar35[5] = -(*(char *)((long)(pdVar10->m_number)._M_elems + 5) == '\0');
              auVar35[6] = -(*(char *)((long)(pdVar10->m_number)._M_elems + 6) == '\0');
              auVar35[7] = -(*(char *)((long)(pdVar10->m_number)._M_elems + 7) == '\0');
              auVar35[8] = -((char)(pdVar10->m_number)._M_elems[2] == '\0');
              auVar35[9] = -(*(char *)((long)(pdVar10->m_number)._M_elems + 9) == '\0');
              auVar35[10] = -(*(char *)((long)(pdVar10->m_number)._M_elems + 10) == '\0');
              auVar35[0xb] = -(*(char *)((long)(pdVar10->m_number)._M_elems + 0xb) == '\0');
              auVar35[0xc] = -((char)(pdVar10->m_number)._M_elems[3] == '\0');
              auVar35[0xd] = -(*(char *)((long)(pdVar10->m_number)._M_elems + 0xd) == '\0');
              auVar35[0xe] = -(*(char *)((long)(pdVar10->m_number)._M_elems + 0xe) == '\0');
              auVar35[0xf] = -(*(char *)((long)(pdVar10->m_number)._M_elems + 0xf) == '\0');
              auVar35 = auVar35 & auVar36;
              if ((ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) != 0xffff) {
                key_18._M_str = "sha1";
                key_18._M_len = 4;
                peVar16 = entry::operator[](peVar16,key_18);
                str.m_len = 0x14;
                str.m_ptr = (char *)(pdVar34 + local_280);
                entry::operator=(peVar16,str);
              }
            }
            local_280 = local_280 + 1;
          } while (local_280 != local_170);
        }
      }
    }
    if (local_238[0x18] != '\0') {
      key_22._M_str = "file tree";
      key_22._M_len = 9;
      local_218 = entry::operator[](this_01,key_22);
      uVar18 = ((long)(this->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      if ((int)uVar18 != 0) {
        local_238._24_8_ = uVar18 & 0xffffffff;
        uVar18 = 0;
        do {
          pcVar22 = (this->m_files).
                    super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    .
                    super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          fVar1.m_val = ((file_flags_t *)((long)(pcVar22 + uVar18) + 0x28))->m_val;
          if ((fVar1.m_val & 1) == 0) {
            pcVar22 = pcVar22 + uVar18;
            pcVar26 = local_258;
            local_268._0_8_ = pcVar26;
            lVar6 = *(long *)&pcVar22->filename;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_268,lVar6,
                       *(size_type *)((long)&pcVar22->filename + 8) + lVar6);
            if ((this->field_0x258 & 1) == 0) {
              local_248._8_8_ = local_268._0_8_;
              local_248._0_8_ = local_268._8_8_;
              local_238._0_8_ = local_268._8_8_;
              local_238._8_8_ = local_268._0_8_;
            }
            else {
              p_03._M_str = pcVar26;
              p_03._M_len = local_268._0_8_;
              lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)local_248,(libtorrent *)local_268._8_8_,p_03);
            }
            p_04._M_str = pcVar26;
            p_04._M_len = local_238._8_8_;
            lsplit_path(&local_208,(libtorrent *)local_238._0_8_,p_04);
            peVar16 = local_218;
            while ((compact_rbtree_node<void_*> *)local_208.first._M_len !=
                   (compact_rbtree_node<void_*> *)0x0) {
              key_23._M_str = local_208.first._M_str;
              key_23._M_len = local_208.first._M_len;
              peVar16 = entry::operator[](peVar16,key_23);
              pdVar23 = entry::dict_abi_cxx11_(peVar16);
              local_1e8._8_8_ = (node_ptr)0x0;
              local_1e8[0x10] = '\0';
              local_210.traits_ =
                   (bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>
                    *)&(pdVar23->
                       super_tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                       ).
                       super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                       .m_icont.
                       super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
              ;
              local_1e8._0_8_ = (compact_rbtree_node<void_*> *)(local_1e8 + 0x10);
              local_168.traits_ = local_210.traits_;
              pcVar24 = boost::intrusive::
                        bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,true>>::
                        find<std::__cxx11::string,boost::intrusive::detail::key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>>,boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>>>>
                                  ((const_node_ptr *)&local_210,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1e8,&local_168);
              pdVar23 = entry::dict_abi_cxx11_(peVar16);
              if ((compact_rbtree_node<void_*> *)local_1e8._0_8_ !=
                  (compact_rbtree_node<void_*> *)(local_1e8 + 0x10)) {
                operator_delete((void *)local_1e8._0_8_,
                                CONCAT71(local_1e8._17_7_,local_1e8[0x10]) + 1);
              }
              if (pcVar24 !=
                  (node_ptr)
                  &(pdVar23->
                   super_tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                   ).
                   super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                   .m_icont.
                   super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                 ) {
                local_1e8._0_4_ = 0xd5;
                aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                          ((error_code_enum *)local_1e8);
              }
              p_05._M_str = pcVar26;
              p_05._M_len = (size_t)local_208.second._M_str;
              lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)local_1e8,(libtorrent *)local_208.second._M_len,p_05);
              local_208.first._M_str = (char *)local_1e8._8_8_;
              local_208.second._M_len = CONCAT71(local_1e8._17_7_,local_1e8[0x10]);
              local_208.second._M_str = (char *)local_1e8._24_8_;
              local_208.first._M_len = local_1e8._0_8_;
            }
            if ((pointer)local_268._0_8_ != (pointer)local_258) {
              operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
            }
            pdVar23 = entry::dict_abi_cxx11_(peVar16);
            if (*(long *)&(pdVar23->
                          super_tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                          ).
                          super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                          .m_icont.
                          super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                          .
                          super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                          .
                          super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                          .super_size_holder<true,_unsigned_long,_void> != 0) {
              local_268._0_4_ = 0xd5;
              aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                        ((error_code_enum *)local_268);
            }
            peVar16 = entry::operator[](peVar16,(string_view)ZEXT816(0));
            if (((this->field_0x258 & 4) != 0) &&
               (lVar6 = *(time_t *)
                         ((long)((this->m_files).
                                 super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                 .
                                 super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar18) + 0x30),
               lVar6 != 0)) {
              key_24._M_str = "mtime";
              key_24._M_len = 5;
              peVar21 = entry::operator[](peVar16,key_24);
              entry::operator=(peVar21,lVar6);
            }
            anon_unknown_40::add_file_attrs(peVar16,fVar1,(bool)((this->field_0x258 & 8) >> 3));
            pcVar22 = (this->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((fVar1.m_val & this->field_0x258 & 8) == 0) {
              if (0 < *(int64_t *)((long)(pcVar22 + uVar18) + 0x20)) {
                uVar12 = local_1c8._0_8_;
                key_25._M_str = "pieces root";
                key_25._M_len = 0xb;
                peVar21 = entry::operator[](peVar16,key_25);
                str_01.m_len = 0x20;
                str_01.m_ptr = (char *)(uVar12 + uVar18 * 0x20);
                entry::operator=(peVar21,str_01);
              }
              iVar11 = *(int64_t *)
                        ((long)((this->m_files).
                                super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                .
                                super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar18) + 0x20);
              key_26._M_str = "length";
              key_26._M_len = 6;
              peVar16 = entry::operator[](peVar16,key_26);
              entry::operator=(peVar16,iVar11);
            }
            else {
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1b0,*(long *)((long)(pcVar22 + uVar18) + 0x38),
                         *(size_type *)((long)(pcVar22 + uVar18) + 0x40) +
                         *(long *)((long)(pcVar22 + uVar18) + 0x38));
              anon_unknown_40::add_symlink_path(peVar16,&local_1b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                operator_delete(local_1b0._M_dataplus._M_p,
                                local_1b0.field_2._M_allocated_capacity + 1);
              }
            }
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != local_238._24_8_);
      }
      key_27._M_str = "meta version";
      key_27._M_len = 0xc;
      peVar16 = entry::operator[](this_01,key_27);
      entry::operator=(peVar16,2);
    }
    iVar31 = this->m_piece_length;
    key_28._M_str = "piece length";
    key_28._M_len = 0xc;
    peVar16 = entry::operator[](this_01,key_28);
    entry::operator=(peVar16,(long)iVar31);
    if (bVar14) {
      key_29._M_str = "pieces";
      key_29._M_len = 6;
      peVar16 = entry::operator[](this_01,key_29);
      psVar25 = entry::string_abi_cxx11_(peVar16);
      pdVar10 = (this->m_piece_hash).
                super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                .
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pdVar34 = (this->m_piece_hash).
                     super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pdVar34 != pdVar10;
          pdVar34 = pdVar34 + 1) {
        ::std::__cxx11::string::append((char *)psVar25,(ulong)pdVar34);
      }
    }
  }
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,(long)local_1b8 - local_1c8._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

entry create_torrent::generate() const
	{
		if (m_files.empty() || m_total_size == 0)
			aux::throw_ex<system_error>(errors::torrent_missing_file_tree);

		// if all v2 hashes are set correctly, generate the v2 parts of the
		// torrent
		bool const make_v2 = validate_v2_hashes(m_files, m_file_piece_hash, m_piece_length);
		bool const make_v1 = validate_v1_hashes(m_piece_hash, m_total_size, m_piece_length);

		// if neither v1 nor v2 hashes were set, we can't create a torrent
		if (!make_v1 && !make_v2)
			aux::throw_ex<system_error>(errors::invalid_hash_entry);

		TORRENT_ASSERT(m_piece_length > 0);

		entry dict;

		if (!m_urls.empty()) dict["announce"] = m_urls.front().first;

		if (!m_nodes.empty())
		{
			entry& nodes = dict["nodes"];
			entry::list_type& nodes_list = nodes.list();
			for (auto const& n : m_nodes)
			{
				entry::list_type node(2);
				node[0] = n.first;
				node[1] = n.second;
				nodes_list.emplace_back(std::move(node));
			}
		}

		if (m_urls.size() > 1)
		{
			entry::list_type trackers;
			entry::list_type tier;
			int current_tier = m_urls.front().second;
			for (auto const& url : m_urls)
			{
				if (url.second != current_tier)
				{
					current_tier = url.second;
					trackers.emplace_back(std::move(tier));
					tier.clear();
				}
				tier.emplace_back(url.first);
			}
			trackers.emplace_back(std::move(tier));
			dict["announce-list"] = std::move(trackers);
		}

		if (!m_comment.empty())
			dict["comment"] = m_comment;

		if (m_creation_date != 0)
			dict["creation date"] = m_creation_date;

		if (!m_created_by.empty())
			dict["created by"] = m_created_by;

		if (!m_url_seeds.empty())
		{
			if (m_url_seeds.size() == 1)
			{
				dict["url-list"] = m_url_seeds.front();
			}
			else
			{
				entry& list = dict["url-list"];
				for (auto const& url : m_url_seeds)
				{
					list.list().emplace_back(url);
				}
			}
		}

		aux::vector<sha256_hash, file_index_t> fileroots;
		if (make_v2)
		{
			TORRENT_ASSERT(!m_file_piece_hash.empty());
			fileroots.resize(m_files.size());

			sha256_hash const pad_hash = merkle_pad(m_piece_length / default_block_size, 1);
			auto& file_pieces = dict["piece layers"].dict();

			for (file_index_t fi : file_range())
			{
				if (m_files[fi].flags & file_storage::flag_pad_file) continue;
				if (m_files[fi].size == 0) continue;

				fileroots[fi] = merkle_root(m_file_piece_hash[fi], pad_hash);

				// files that only have one piece store the piece hash as the
				// root, we don't need a pieces layer entry for such files
				if (m_file_piece_hash[fi].size() < 2) continue;
				auto& pieces = file_pieces[fileroots[fi].to_string()].string();
				pieces.clear();
				pieces.reserve(m_file_piece_hash[fi].size() * sha256_hash::size());
				for (auto const& p : m_file_piece_hash[fi])
					pieces.append(reinterpret_cast<const char*>(p.data()), p.size());
			}
		}

		entry& info = dict["info"];
#if TORRENT_ABI_VERSION < 4
		if (m_info_dict.type() == entry::dictionary_t
			|| m_info_dict.type() == entry::preformatted_t)
		{
			info = m_info_dict;
			return dict;
		}
#endif

		if (!m_collections.empty())
		{
			entry& list = info["collections"];
			for (auto const& c : m_collections)
			{
				list.list().emplace_back(c);
			}
		}

		if (!m_similar.empty())
		{
			entry& list = info["similar"];
			for (auto const& ih : m_similar)
			{
				list.list().emplace_back(ih);
			}
		}

		info["name"] = m_name;

		if (!m_root_cert.empty())
			info["ssl-cert"] = m_root_cert;

		if (m_private) info["private"] = 1;

		if (make_v1)
		{
			if (!m_multifile)
			{
				auto const& file = m_files.front();
				if (m_include_mtime && file.mtime)
					info["mtime"] = file.mtime;
				info["length"] = file.size;
				file_flags_t const flags = file.flags;
				add_file_attrs(info, flags, m_include_symlinks);
				if (m_include_symlinks
					&& (flags & file_storage::flag_symlink))
				{
					add_symlink_path(info, file.symlink);
				}
#if TORRENT_ABI_VERSION < 3
				if (!m_filehashes.empty())
				{
					info["sha1"] = m_filehashes.front();
				}
#endif
			}
			else
			{
				entry& files = info["files"];

				for (auto const i : file_range())
				{
					files.list().emplace_back();
					entry& file_e = files.list().back();
					if (m_include_mtime && m_files[i].mtime) file_e["mtime"] = m_files[i].mtime;
					file_e["length"] = m_files[i].size;

					TORRENT_ASSERT(has_parent_path(m_files[i].filename));

					{
						entry& path_e = file_e["path"];

						std::string const p = m_files[i].filename;
						// deliberately skip the first path element, since that's the
						// "name" of the torrent already
						string_view path = lsplit_path(p).second;
						for (auto elems = lsplit_path(path); !elems.first.empty(); elems = lsplit_path(elems.second))
							path_e.list().emplace_back(elems.first);
					}

					file_flags_t const flags = m_files[i].flags;
					add_file_attrs(file_e, flags, m_include_symlinks);

					if (m_include_symlinks && (flags & file_storage::flag_symlink))
					{
						add_symlink_path(file_e, m_files[i].symlink);
					}
#if TORRENT_ABI_VERSION < 3
					if (!m_filehashes.empty() && m_filehashes[i] != sha1_hash())
					{
						file_e["sha1"] = m_filehashes[i];
					}
#endif
				}
			}
		}

		if (make_v2)
		{
			auto& tree = info["file tree"];

			for (file_index_t i : file_range())
			{
				file_flags_t const flags = m_files[i].flags;
				if (flags & file_storage::flag_pad_file) continue;

				entry* file_e_ptr = &tree;

				{
					std::string const file_path = m_files[i].filename;
					auto const split = m_multifile
						? lsplit_path(file_path)
						: std::pair<string_view, string_view>(file_path, file_path);
					TORRENT_ASSERT(split.first == m_name);

					for (auto e = lsplit_path(split.second);
						!e.first.empty();
						e = lsplit_path(e.second))
					{
						file_e_ptr = &(*file_e_ptr)[e.first];
						if (file_e_ptr->dict().find({}) != file_e_ptr->dict().end())
						{
							// path conflict
							// there is already a file with this name
							// refuse to generate a torrent with such a conflict
							aux::throw_ex<system_error>(errors::torrent_inconsistent_files);
						}
					}
				}

				if (!file_e_ptr->dict().empty())
				{
					// path conflict
					// there is already a directory with this name
					// refuse to generate a torrent with such a conflict
					aux::throw_ex<system_error>(errors::torrent_inconsistent_files);
				}

				entry& file_e = (*file_e_ptr)[{}];

				if (m_include_mtime && m_files[i].mtime) file_e["mtime"] = m_files[i].mtime;

				add_file_attrs(file_e, flags, m_include_symlinks);

				if (m_include_symlinks && (flags & file_storage::flag_symlink))
				{
					add_symlink_path(file_e, m_files[i].symlink);
				}
				else
				{
					if (m_files[i].size > 0)
						file_e["pieces root"] = fileroots[i];
					file_e["length"] = m_files[i].size;
				}
			}
			info["meta version"] = 2;
		}

		info["piece length"] = m_piece_length;

		if (make_v1)
		{
			std::string& p = info["pieces"].string();

			for (sha1_hash const& h : m_piece_hash)
				p.append(h.data(), h.size());
		}

		return dict;
	}